

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

int __thiscall TPZCheckMesh::CheckConstraintDimension(TPZCheckMesh *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TPZSavable TVar3;
  int iVar4;
  TPZConnect *pTVar5;
  ostream *poVar6;
  long *plVar7;
  TPZCompEl **ppTVar8;
  long lVar9;
  TPZCompEl *pTVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  uint uVar14;
  _Base_ptr p_Var15;
  _Rb_tree_header *p_Var16;
  long lVar17;
  undefined8 extraout_RDX;
  undefined8 uVar18;
  _Self __tmp;
  long nelem;
  int iVar19;
  TPZDepend *dep;
  TPZDepend *pTVar20;
  int iVar21;
  int iVar22;
  pair<std::_Rb_tree_iterator<long>,_bool> pVar23;
  TPZCompElSide large;
  TPZVec<long> connecttoel;
  set<long,_std::less<long>,_std::allocator<long>_> largecon;
  TPZStack<TPZCompElSide,_10> equal;
  TPZGeoElSide gelside;
  set<long,_std::less<long>,_std::allocator<long>_> badcon;
  set<long,_std::less<long>,_std::allocator<long>_> badelements;
  TPZGeoElSide gellarge;
  TPZGeoElSide local_220;
  undefined **local_208;
  int local_1fc;
  _func_int **local_1f8;
  TPZCompEl *local_1f0;
  TPZVec<long> local_1e8;
  _func_int **local_1c8;
  undefined **local_1c0;
  long local_1b8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_1b0;
  TPZStack<TPZCompElSide,_10> local_180;
  undefined **local_c0;
  TPZGeoEl *local_b8;
  int local_b0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TPZGeoElSide local_48;
  
  lVar17 = (long)(int)(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_220.fSide = 0;
  local_220._20_4_ = 0;
  local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < lVar17) {
    local_220.fSide = 0;
    local_220._20_4_ = 0;
    do {
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                          (int64_t)local_180.super_TPZManVector<TPZCompElSide,_10>.
                                   super_TPZVec<TPZCompElSide>._vptr_TPZVec);
      uVar14 = (uint)pTVar5->fSequenceNumber;
      if ((-1 < (int)uVar14) && (pTVar20 = pTVar5->fDependList, pTVar20 != (TPZDepend *)0x0)) {
        iVar4 = (this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                [uVar14 & 0x7fffffff].dim;
        do {
          iVar22 = (int)(pTVar20->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow;
          iVar21 = (int)(pTVar20->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fCol;
          iVar19 = (int)pTVar20->fDepConnectIndex;
          pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                             (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                              (long)iVar19);
          iVar2 = (this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                  [(int)pTVar5->fSequenceNumber].dim;
          if ((this->fNState * iVar22 != iVar4) || (this->fNState * iVar21 != iVar2)) {
            std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
            _M_insert_unique<long_const&>
                      ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&local_a8,(long *)&local_180);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"TPZCheckMesh::CheckConstraintDi.. ic = ",0x27);
            poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," depends on ",0xc);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," r ",3);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," iblsize ",9);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," c ",3);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar21);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," jblsize ",9);
            plVar7 = (long *)std::ostream::operator<<(poVar6,iVar2);
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            local_220.fSide = 1;
            local_220._20_4_ = 0;
            std::ostream::flush();
          }
          pTVar20 = pTVar20->fNext;
        } while (pTVar20 != (TPZDepend *)0x0);
      }
      local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
           (_func_int **)
           ((long)local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  _vptr_TPZVec + 1);
    } while ((long)local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                   _vptr_TPZVec < lVar17);
  }
  local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)0xffffffffffffffff;
  TPZVec<long>::TPZVec
            (&local_1e8,(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements,
             (long *)&local_180);
  lVar17 = (this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar17) {
    nelem = 0;
    do {
      ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar10 = *ppTVar8;
      if ((pTVar10 != (TPZCompEl *)0x0) &&
         (iVar4 = (**(code **)(*(long *)pTVar10 + 0x90))(pTVar10), 0 < iVar4)) {
        iVar22 = 0;
        do {
          lVar9 = (**(code **)(*(long *)pTVar10 + 0xa0))(pTVar10,iVar22);
          if (local_1e8.fStore[lVar9] == -1) {
            local_1e8.fStore[lVar9] = nelem;
          }
          iVar22 = iVar22 + 1;
        } while (iVar4 != iVar22);
      }
      nelem = nelem + 1;
    } while (nelem != lVar17);
  }
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_a8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_a8._M_impl.super__Rb_tree_header) {
    p_Var1 = &local_1b0._M_impl.super__Rb_tree_header;
    local_1c0 = &PTR__TPZGeoElSide_01920090;
    local_208 = &PTR__TPZManVector_018424d8;
    local_1c8 = (_func_int **)&PTR__TPZManVector_01842198;
    local_1f8 = (_func_int **)&PTR__TPZVec_0183b970;
    p_Var12 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (local_1e8.fStore[*(long *)(p_Var12 + 1)] == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Connect ",8);
        poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," has dependency but does not belong to an element\n",0x32);
      }
      ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                           local_1e8.fStore[*(long *)(p_Var12 + 1)]);
      if (*ppTVar8 == (TPZCompEl *)0x0) {
        pTVar10 = (TPZCompEl *)0x0;
      }
      else {
        pTVar10 = (TPZCompEl *)
                  __dynamic_cast(*ppTVar8,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      }
      if (pTVar10 == (TPZCompEl *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"I dont understand\n",0x12);
      }
      else {
        local_1f0 = pTVar10;
        local_1fc = (**(code **)(*(long *)pTVar10 + 0x90))();
        if (0 < local_1fc) {
          iVar4 = 0;
          do {
            lVar17 = (**(code **)(*(long *)local_1f0 + 0xa0))(local_1f0,iVar4);
            if (lVar17 == *(long *)(p_Var12 + 1)) {
              local_b8 = TPZCompEl::Reference(local_1f0);
              local_c0 = local_1c0;
              local_b0 = iVar4;
              TPZGeoElSide::LowerLevelCompElementList2(&local_220,(int)&local_c0);
              if ((TPZCompEl *)local_220.super_TPZSavable._vptr_TPZSavable == (TPZCompEl *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"I dont understand\n",0x12);
              }
              else {
                TPZCompElSide::Reference(&local_48,(TPZCompElSide *)&local_220);
                lVar17 = 0x28;
                do {
                  *(undefined8 *)
                   ((long)local_180.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar17 + -0x28
                   ) = 0;
                  *(undefined4 *)
                   ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                            (local_180.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                           super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar17) = 0xffffffff;
                  lVar17 = lVar17 + 0x10;
                } while (lVar17 != 200);
                local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
                     local_180.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
                local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                fNElements = 0;
                local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc
                     = 0;
                local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                _vptr_TPZVec = local_1c8;
                TPZGeoElSide::EqualLevelCompElementList(&local_48,&local_180,1,0);
                iVar22 = (int)local_220.fGeoEl;
                TVar3._vptr_TPZSavable = local_220.super_TPZSavable._vptr_TPZSavable;
                (*local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  _vptr_TPZVec[3])(&local_180,
                                   local_180.super_TPZManVector<TPZCompElSide,_10>.
                                   super_TPZVec<TPZCompElSide>.fNElements + 1);
                local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore
                [local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                 fNElements + -1].fEl = (TPZCompEl *)TVar3._vptr_TPZSavable;
                local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore
                [local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                 fNElements + -1].fSide = iVar22;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Connect index ",0xe);
                poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," belongs to element ",0x14);
                poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," and is restrained by element ",0x1e);
                if (0 < local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                        fNElements) {
                  lVar17 = 0;
                  do {
                    poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < local_180.super_TPZManVector<TPZCompElSide,_10>.
                                    super_TPZVec<TPZCompElSide>.fNElements);
                }
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                std::ostream::put(-0x58);
                std::ostream::flush();
                local_1b0._M_impl._0_8_ = local_220.super_TPZSavable._vptr_TPZSavable[2];
                std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                _M_insert_unique<long>(&local_78,(long *)&local_1b0);
                iVar22 = (**(code **)(*local_220.super_TPZSavable._vptr_TPZSavable + 0x90))();
                local_1b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_1b0._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1b0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
                local_1b0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
                if (0 < iVar22) {
                  iVar21 = 0;
                  uVar18 = extraout_RDX;
                  do {
                    local_1b8 = (**(code **)(*local_220.super_TPZSavable._vptr_TPZSavable + 0xa0))
                                          (local_220.super_TPZSavable._vptr_TPZSavable,iVar21,uVar18
                                          );
                    pVar23 = std::
                             _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                             ::_M_insert_unique<long>(&local_1b0,&local_1b8);
                    uVar18 = pVar23._8_8_;
                    iVar21 = iVar21 + 1;
                  } while (iVar22 != iVar21);
                }
                pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                                   (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>
                                    ,*(int64_t *)(p_Var12 + 1));
                for (pTVar20 = pTVar5->fDependList; pTVar20 != (TPZDepend *)0x0;
                    pTVar20 = pTVar20->fNext) {
                  p_Var11 = &p_Var1->_M_header;
                  if (local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
                  {
                    p_Var15 = local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent;
                    do {
                      if (pTVar20->fDepConnectIndex <= (long)*(size_t *)(p_Var15 + 1)) {
                        p_Var11 = p_Var15;
                      }
                      p_Var15 = (&p_Var15->_M_left)
                                [(long)*(size_t *)(p_Var15 + 1) < pTVar20->fDepConnectIndex];
                    } while (p_Var15 != (_Base_ptr)0x0);
                  }
                  p_Var16 = p_Var1;
                  if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
                     (p_Var16 = (_Rb_tree_header *)p_Var11,
                     pTVar20->fDepConnectIndex < (long)((_Rb_tree_header *)p_Var11)->_M_node_count))
                  {
                    p_Var16 = p_Var1;
                  }
                  if (p_Var16 == p_Var1) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"The connect ",0xc);
                    poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6," belongs to element ",0x14);
                    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6," as connect ",0xc);
                    plVar7 = (long *)std::ostream::operator<<(poVar6,iVar4);
                    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
                    std::ostream::put((char)plVar7);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "The element is restrained along this side to element ",0x35);
                    poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                    std::ostream::put((char)poVar6);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"The connect ",0xc);
                    poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6," depends on connect ",0x14);
                    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6," The connect of the large element are ",0x26);
                    if (0 < iVar22) {
                      iVar21 = 0;
                      do {
                        (**(code **)(*local_220.super_TPZSavable._vptr_TPZSavable + 0xa0))
                                  (local_220.super_TPZSavable._vptr_TPZSavable,iVar21);
                        poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                        iVar21 = iVar21 + 1;
                      } while (iVar22 != iVar21);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                    std::ostream::put(-0x58);
                    std::ostream::flush();
                  }
                }
                std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                ~_Rb_tree(&local_1b0);
                if (local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                    fStore == local_180.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
                  local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore
                       = (TPZCompElSide *)0x0;
                }
                local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc
                     = 0;
                local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                _vptr_TPZVec = local_1f8;
                if (local_180.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                    fStore != (TPZCompElSide *)0x0) {
                  operator_delete__(local_180.super_TPZManVector<TPZCompElSide,_10>.
                                    super_TPZVec<TPZCompElSide>.fStore);
                }
              }
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 != local_1fc);
        }
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != &local_a8._M_impl.super__Rb_tree_header);
  }
  for (p_Var13 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != &local_78._M_impl.super__Rb_tree_header;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                         *(int64_t *)(p_Var13 + 1));
    (**(code **)(*(long *)*ppTVar8 + 200))(*ppTVar8,&std::cout);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_1e8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_1e8.fStore != (long *)0x0) {
    operator_delete__(local_1e8.fStore);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  return local_220.fSide;
}

Assistant:

int TPZCheckMesh::CheckConstraintDimension()
{
	int check = 0;
	int ncon = fMesh->ConnectVec().NElements();
    std::set<int64_t> badcon;
	for(int64_t ic=0; ic<ncon; ic++) {
		TPZConnect &con = fMesh->ConnectVec()[ic];
		int iseqnum = con.SequenceNumber();
        if (iseqnum < 0) {
            continue;
        }
		int iblsize = fMesh->Block().Size(iseqnum);
		if(con.HasDependency()) {
			TPZConnect::TPZDepend *dep = con.FirstDepend();
			while(dep) {
				int r = dep->fDepMatrix.Rows();
				int c = dep->fDepMatrix.Cols();
				int jcind = dep->fDepConnectIndex;
				TPZConnect &jcon = fMesh->ConnectVec()[jcind];
				int jseqnum = jcon.SequenceNumber();
				int jblsize = fMesh->Block().Size(jseqnum);
				if(r*fNState != iblsize || c*fNState != jblsize) {
                    badcon.insert(ic);
					cout << "TPZCheckMesh::CheckConstraintDi.. ic = " << ic
					<< " depends on " << jcind << " r " << r << " iblsize "
					<< iblsize  << " c " << c << " jblsize " << jblsize << endl;
					check = 1;
				}
				dep = dep->fNext;
			}
		}
	}
    TPZVec<int64_t> connecttoel(fMesh->NConnects(),-1);
    int64_t nelem = fMesh->NElements();
    for (int64_t el=0; el<nelem; el++) {
        TPZCompEl *cel = fMesh->Element(el);
        if (!cel) {
            continue;
        }
        int nc = cel->NConnects();
        for (int ic=0; ic<nc; ic++) {
            int64_t cindex = cel->ConnectIndex(ic);
            if (connecttoel[cindex] == -1) {
                connecttoel[cindex] = el;
            }
        }
    }
    std::set<int64_t> badelements;
    for (std::set<int64_t>::iterator it = badcon.begin(); it != badcon.end(); it++) {
        /// find the element that contains badcon
        if (connecttoel[*it] == -1) {
            std::cout << "Connect " << *it << " has dependency but does not belong to an element\n";
        }
        TPZCompEl *cel = fMesh->Element(connecttoel[*it]);
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        if (!intel) {
            std::cout << "I dont understand\n";
            continue;
        }
        int nc = intel->NConnects();
        for (int ic = 0; ic<nc; ic++) {
            if (intel->ConnectIndex(ic) == *it)
            {
                TPZGeoEl *ref = intel->Reference();
                TPZGeoElSide gelside(ref,ic);
                TPZCompElSide large = gelside.LowerLevelCompElementList2(1);
                if (!large) {
                    std::cout << "I dont understand\n";
                    continue;
                }
                TPZGeoElSide gellarge = large.Reference();
                TPZStack<TPZCompElSide> equal;
                gellarge.EqualLevelCompElementList(equal, 1, 0);
                equal.Push(large);
                std::cout << "Connect index " << *it << " belongs to element " << connecttoel[*it] << " and is restrained by element ";
                for(int i=0; i< equal.size(); i++) std::cout << equal[i].Element()->Index() << " ";
                std::cout << std::endl;
                badelements.insert(large.Element()->Index());
                
                int nclarge = large.Element()->NConnects();
                std::set<int64_t> largecon;
                for (int icl=0; icl< nclarge; icl++) {
                    largecon.insert(large.Element()->ConnectIndex(icl));
                }
                TPZConnect &c = fMesh->ConnectVec()[*it];
                TPZConnect::TPZDepend *dep = c.FirstDepend();
                while(dep)
                {
                    if (largecon.find(dep->fDepConnectIndex) == largecon.end()) {
                        std::cout << "The connect " << *it << " belongs to element " << connecttoel[*it] << " as connect " << ic << std::endl;
                        std::cout << "The element is restrained along this side to element " << large.Element()->Index() << std::endl;
                        std::cout << "The connect " << *it << " depends on connect " << dep->fDepConnectIndex << " The connect of the large element are ";
                        for (int ic=0; ic<nclarge; ic++) {
                            std::cout << large.Element()->ConnectIndex(ic) << " ";
                        }
                        std::cout << std::endl;
                    }
                    dep = dep->fNext;
                }
            }
        }
    }
    for (std::set<int64_t>::iterator it=badelements.begin(); it != badelements.end(); it++) {
        fMesh->Element(*it)->Print();
    }
	return check;
}